

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

GenericVec4
deqp::gles31::Functional::anon_unknown_1::mapToFormatColorRepresentable
          (TextureFormat *texFormat,Vec4 *normalizedRange)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  TextureChannelClass TVar9;
  void *data;
  float *pfVar10;
  int *piVar11;
  Vector<unsigned_int,_4> local_1c4;
  undefined1 local_1b4 [16];
  Vector<unsigned_int,_4> local_1a4;
  UVec4 local_194;
  Vector<int,_4> local_184;
  undefined1 local_174 [16];
  Vector<int,_4> local_164;
  IVec4 local_154;
  Vector<float,_4> local_144;
  undefined1 local_134 [16];
  Vector<float,_4> local_124;
  Vec4 local_114;
  undefined4 local_104;
  Vector<float,_4> local_100;
  Vector<float,_4> local_f0;
  Vector<float,_4> local_e0;
  undefined1 local_d0 [8];
  Vec4 linearized;
  IVec4 sRGB8;
  Vec4 sRGB;
  Vector<int,_3> local_84;
  undefined1 local_78 [8];
  PixelBufferAccess access;
  ArrayBuffer<unsigned_char,_4UL,_1UL> buffer;
  BVec4 channelMask;
  GenericVec4 inFormatUnits;
  Vec4 *normalizedRange_local;
  TextureFormat *texFormat_local;
  
  mapToFormatColorUnits(texFormat,normalizedRange);
  tcu::getTextureFormatChannelMask((tcu *)((long)&buffer.m_cap + 4),texFormat);
  iVar8 = tcu::TextureFormat::getPixelSize(texFormat);
  de::ArrayBuffer<unsigned_char,_4UL,_1UL>::ArrayBuffer
            ((ArrayBuffer<unsigned_char,_4UL,_1UL> *)&access.super_ConstPixelBufferAccess.m_data,
             (long)iVar8);
  tcu::Vector<int,_3>::Vector(&local_84,1,1,1);
  data = de::ArrayBuffer<unsigned_char,_4UL,_1UL>::getPtr
                   ((ArrayBuffer<unsigned_char,_4UL,_1UL> *)
                    &access.super_ConstPixelBufferAccess.m_data);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_78,texFormat,&local_84,data);
  bVar3 = tcu::isSRGB(*texFormat);
  if (bVar3) {
    tcu::linearToSRGB((tcu *)(sRGB8.m_data + 2),normalizedRange);
    pfVar10 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(sRGB8.m_data + 2),0);
    bVar4 = tcu::floatToU8(*pfVar10);
    pfVar10 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(sRGB8.m_data + 2),1);
    bVar5 = tcu::floatToU8(*pfVar10);
    pfVar10 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(sRGB8.m_data + 2),2);
    bVar6 = tcu::floatToU8(*pfVar10);
    pfVar10 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(sRGB8.m_data + 2),3);
    bVar7 = tcu::floatToU8(*pfVar10);
    tcu::Vector<int,_4>::Vector
              ((Vector<int,_4> *)(linearized.m_data + 2),(uint)bVar4,(uint)bVar5,(uint)bVar6,
               (uint)bVar7);
    piVar11 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(linearized.m_data + 2),0);
    iVar8 = *piVar11;
    piVar11 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(linearized.m_data + 2),1);
    iVar1 = *piVar11;
    piVar11 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(linearized.m_data + 2),2);
    iVar2 = *piVar11;
    piVar11 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(linearized.m_data + 2),3);
    tcu::Vector<float,_4>::Vector
              (&local_e0,(float)iVar8 / 255.0,(float)iVar1 / 255.0,(float)iVar2 / 255.0,
               (float)*piVar11 / 255.0);
    tcu::sRGBToLinear((tcu *)local_d0,&local_e0);
    tcu::Vector<float,_4>::Vector(&local_100,0.0);
    tcu::select<float,4>
              ((tcu *)&local_f0,(Vector<float,_4> *)local_d0,&local_100,
               (Vector<bool,_4> *)((long)&buffer.m_cap + 4));
    rr::GenericVec4::GenericVec4<float>((GenericVec4 *)&texFormat_local,&local_f0);
  }
  else {
    TVar9 = tcu::getTextureChannelClass(texFormat->type);
    switch(TVar9) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      rr::GenericVec4::get<float>((GenericVec4 *)&local_114);
      tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)local_78,&local_114,0,0,0);
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_134,(int)local_78,0,0);
      tcu::Vector<float,_4>::Vector(&local_144,0.0);
      tcu::select<float,4>
                ((tcu *)&local_124,(Vector<float,_4> *)local_134,&local_144,
                 (Vector<bool,_4> *)((long)&buffer.m_cap + 4));
      rr::GenericVec4::GenericVec4<float>((GenericVec4 *)&texFormat_local,&local_124);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      rr::GenericVec4::get<int>((GenericVec4 *)&local_154);
      tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)local_78,&local_154,0,0,0);
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_174,(int)local_78,0,0);
      tcu::Vector<int,_4>::Vector(&local_184,0);
      tcu::select<int,4>((tcu *)&local_164,(Vector<int,_4> *)local_174,&local_184,
                         (Vector<bool,_4> *)((long)&buffer.m_cap + 4));
      rr::GenericVec4::GenericVec4<int>((GenericVec4 *)&texFormat_local,&local_164);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      rr::GenericVec4::get<unsigned_int>((GenericVec4 *)&local_194);
      tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)local_78,&local_194,0,0,0);
      tcu::ConstPixelBufferAccess::getPixelUint
                ((ConstPixelBufferAccess *)local_1b4,(int)local_78,0,0);
      tcu::Vector<unsigned_int,_4>::Vector(&local_1c4,0);
      tcu::select<unsigned_int,4>
                ((tcu *)&local_1a4,(Vector<unsigned_int,_4> *)local_1b4,&local_1c4,
                 (Vector<bool,_4> *)((long)&buffer.m_cap + 4));
      rr::GenericVec4::GenericVec4<unsigned_int>((GenericVec4 *)&texFormat_local,&local_1a4);
      break;
    default:
      rr::GenericVec4::GenericVec4((GenericVec4 *)&texFormat_local);
    }
  }
  local_104 = 1;
  de::ArrayBuffer<unsigned_char,_4UL,_1UL>::~ArrayBuffer
            ((ArrayBuffer<unsigned_char,_4UL,_1UL> *)&access.super_ConstPixelBufferAccess.m_data);
  return (GenericVec4)_texFormat_local;
}

Assistant:

rr::GenericVec4 mapToFormatColorRepresentable (const tcu::TextureFormat& texFormat, const tcu::Vec4& normalizedRange)
{
	// make sure value is representable in the target format and clear channels
	// not present in the target format.

	const rr::GenericVec4		inFormatUnits	= mapToFormatColorUnits(texFormat, normalizedRange);
	const tcu::BVec4			channelMask		= tcu::getTextureFormatChannelMask(texFormat);
	de::ArrayBuffer<deUint8, 4>	buffer			(texFormat.getPixelSize());
	tcu::PixelBufferAccess		access			(texFormat, tcu::IVec3(1, 1, 1), buffer.getPtr());

	if (tcu::isSRGB(texFormat))
	{
		DE_ASSERT(texFormat.type == tcu::TextureFormat::UNORM_INT8);

		// make sure border color (in linear space) can be converted to 8-bit sRGB space without
		// significant loss.
		const tcu::Vec4		sRGB		= tcu::linearToSRGB(normalizedRange);
		const tcu::IVec4	sRGB8		= tcu::IVec4(tcu::floatToU8(sRGB[0]),
													 tcu::floatToU8(sRGB[1]),
													 tcu::floatToU8(sRGB[2]),
													 tcu::floatToU8(sRGB[3]));
		const tcu::Vec4		linearized	= tcu::sRGBToLinear(tcu::Vec4((float)sRGB8[0] / 255.0f,
																	  (float)sRGB8[1] / 255.0f,
																	  (float)sRGB8[2] / 255.0f,
																	  (float)sRGB8[3] / 255.0f));

		return rr::GenericVec4(tcu::select(linearized, tcu::Vec4(0.0f), channelMask));
	}

	switch (tcu::getTextureChannelClass(texFormat.type))
	{
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		{
			access.setPixel(inFormatUnits.get<float>(), 0, 0);
			return rr::GenericVec4(tcu::select(access.getPixel(0, 0), tcu::Vec4(0.0f), channelMask));
		}
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
		{
			access.setPixel(inFormatUnits.get<deInt32>(), 0, 0);
			return rr::GenericVec4(tcu::select(access.getPixelInt(0, 0), tcu::IVec4(0), channelMask));
		}
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
		{
			access.setPixel(inFormatUnits.get<deUint32>(), 0, 0);
			return rr::GenericVec4(tcu::select(access.getPixelUint(0, 0), tcu::UVec4(0u), channelMask));
		}
		default:
		{
			DE_ASSERT(false);
			return rr::GenericVec4();
		}
	}
}